

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

_Bool SystemZ_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  DecodeStatus DVar1;
  ushort local_5a;
  uint8_t *puStack_58;
  uint16_t I;
  uint8_t *Table;
  uint64_t uStack_48;
  uint8_t Bytes [6];
  uint64_t Inst;
  uint64_t address_local;
  uint16_t *size_local;
  MCInst *MI_local;
  size_t code_len_local;
  uint8_t *code_local;
  csh ud_local;
  
  if (*code < 0x40) {
    *size = 2;
    puStack_58 = DecoderTable16;
  }
  else if (*code < 0xc0) {
    *size = 4;
    puStack_58 = DecoderTable32;
  }
  else {
    *size = 6;
    puStack_58 = DecoderTable48;
  }
  if (code_len < *size) {
    ud_local._7_1_ = false;
  }
  else {
    if (MI->flat_insn->detail != (cs_detail *)0x0) {
      memset(MI->flat_insn->detail,0,0x5f8);
    }
    memcpy((void *)((long)&Table + 2),code,(ulong)*size);
    uStack_48 = 0;
    for (local_5a = 0; local_5a < *size; local_5a = local_5a + 1) {
      uStack_48 = uStack_48 << 8 | (ulong)*(byte *)((long)&Table + (ulong)local_5a + 2);
    }
    DVar1 = decodeInstruction(puStack_58,MI,uStack_48,address,(MCRegisterInfo *)info,0);
    ud_local._7_1_ = DVar1 != MCDisassembler_Fail;
  }
  return ud_local._7_1_;
}

Assistant:

bool SystemZ_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint64_t Inst;
	uint8_t Bytes[6];
	uint8_t *Table;
	uint16_t I; 

	// The top 2 bits of the first byte specify the size.
	if (*code < 0x40) {
		*size = 2;
		Table = DecoderTable16;
	} else if (*code < 0xc0) {
		*size = 4;
		Table = DecoderTable32;
	} else {
		*size = 6;
		Table = DecoderTable48;
	}

	if (code_len < *size)
		// short of input data
		return MCDisassembler_Fail;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	memcpy(Bytes, code, *size);

	// Construct the instruction.
	Inst = 0;
	for (I = 0; I < *size; ++I)
		Inst = (Inst << 8) | Bytes[I];

	return decodeInstruction(Table, MI, Inst, address, info, 0);
}